

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O1

void __thiscall QTimer::start(QTimer *this,milliseconds interval)

{
  QObjectData *pQVar1;
  parameter_type pVar2;
  milliseconds mVar3;
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  *this_00;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  mVar3 = checkInterval("QTimer::start",interval);
  this_00 = (QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
             *)((long)&pQVar1[1].children.d.size + 4);
  pVar2 = QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
          ::value(this_00);
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  ::setValue(this_00,(int)mVar3.__r);
  start(this);
  if (pVar2 == (int)mVar3.__r) {
    return;
  }
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  ::notify(this_00);
  return;
}

Assistant:

void QTimer::start(std::chrono::milliseconds interval)
{
    Q_D(QTimer);

    interval = checkInterval("QTimer::start", interval);
    const int msec = interval.count();
    const bool intervalChanged = msec != d->inter;
    d->inter.setValue(msec);
    start();
    if (intervalChanged)
        d->inter.notify();
}